

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic-ops.h
# Opt level: O3

void uv__async_close(uv_async_t *handle)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  
  LOCK();
  iVar4 = handle->pending;
  if (iVar4 == 2) {
    handle->pending = 0;
    iVar4 = 2;
  }
  UNLOCK();
  while (iVar4 == 1) {
    LOCK();
    iVar4 = handle->pending;
    if (iVar4 == 2) {
      handle->pending = 0;
      iVar4 = 2;
    }
    UNLOCK();
  }
  pvVar3 = handle->queue[0];
  *(void **)handle->queue[1] = pvVar3;
  *(void **)((long)pvVar3 + 8) = handle->queue[1];
  uVar2 = handle->flags;
  if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  return;
}

Assistant:

UV_UNUSED(static int cmpxchgi(int* ptr, int oldval, int newval)) {
#if defined(__i386__) || defined(__x86_64__)
  int out;
  __asm__ __volatile__ ("lock; cmpxchg %2, %1;"
                        : "=a" (out), "+m" (*(volatile int*) ptr)
                        : "r" (newval), "0" (oldval)
                        : "memory");
  return out;
#elif defined(__MVS__)
  unsigned int op4;
  if (__plo_CSST(ptr, (unsigned int*) &oldval, newval,
                (unsigned int*) ptr, *ptr, &op4))
    return oldval;
  else
    return op4;
#elif defined(__SUNPRO_C) || defined(__SUNPRO_CC)
  return atomic_cas_uint((uint_t *)ptr, (uint_t)oldval, (uint_t)newval);
#else
  return __sync_val_compare_and_swap(ptr, oldval, newval);
#endif
}